

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

bool __thiscall tcu::CommandLine::parse(CommandLine *this,int argc,char **argv)

{
  CommandLine *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Entry *pEVar5;
  ostream *poVar6;
  bool bVar7;
  Parser parser;
  ostream debugOut;
  DebugOutStreambuf sbuf;
  allocator<char> local_351;
  Parser local_350;
  string local_338;
  FilePath local_318;
  long local_2f8;
  ios_base local_2f0 [264];
  DebugOutStreambuf local_1e8;
  
  DebugOutStreambuf::DebugOutStreambuf(&local_1e8);
  std::ostream::ostream(&local_2f8,&local_1e8.super_streambuf);
  de::cmdline::detail::Parser::Parser(&local_350);
  opt::registerOptions(&local_350);
  opt::registerLegacyOptions(&local_350);
  (**this->_vptr_CommandLine)(this,&local_350);
  this_00 = &this->m_cmdLine;
  de::cmdline::detail::CommandLine::clear(this_00);
  this->m_logFlags = 0;
  bVar1 = de::cmdline::detail::Parser::parse
                    (&local_350,argc + -1,argv + 1,this_00,(ostream *)&std::cerr);
  if (bVar1) {
    pEVar5 = de::cmdline::detail::TypedFieldMap::get
                       (&this_00->m_options,(type_info *)&opt::LogImages::typeinfo);
    if (*pEVar5->value == '\0') {
      *(byte *)&this->m_logFlags = (byte)this->m_logFlags | 1;
    }
    pEVar5 = de::cmdline::detail::TypedFieldMap::get
                       (&this_00->m_options,(type_info *)&opt::LogShaderSources::typeinfo);
    if (*pEVar5->value == '\0') {
      *(byte *)&this->m_logFlags = (byte)this->m_logFlags | 2;
    }
    pEVar5 = de::cmdline::detail::TypedFieldMap::get
                       (&this_00->m_options,(type_info *)&opt::LogFlush::typeinfo);
    if (*pEVar5->value == '\0') {
      *(byte *)&this->m_logFlags = (byte)this->m_logFlags | 4;
    }
    bVar1 = de::cmdline::detail::TypedFieldMap::contains
                      (&this_00->m_options,(type_info *)&opt::CasePath::typeinfo);
    bVar2 = de::cmdline::detail::TypedFieldMap::contains
                      (&this_00->m_options,(type_info *)&opt::CaseList::typeinfo);
    bVar3 = de::cmdline::detail::TypedFieldMap::contains
                      (&this_00->m_options,(type_info *)&opt::CaseListFile::typeinfo);
    bVar4 = de::cmdline::detail::TypedFieldMap::contains
                      (&this_00->m_options,(type_info *)&opt::CaseListResource::typeinfo);
    pEVar5 = de::cmdline::detail::TypedFieldMap::get
                       (&this_00->m_options,(type_info *)&opt::StdinCaseList::typeinfo);
    bVar7 = true;
    if ((uint)*pEVar5->value + (uint)bVar4 + (uint)bVar3 + (uint)bVar2 + (uint)bVar1 < 2)
    goto LAB_00307323;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2f8,"ERROR: multiple test case list options given!\n",0x2e);
    std::ios::widen((char)(ostream *)&local_2f8 + (char)*(undefined8 *)(local_2f8 + -0x18));
    std::ostream::put((char)&local_2f8);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,"\n",1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,*argv,&local_351);
    de::FilePath::getBaseName_abi_cxx11_(&local_338,&local_318);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2f8,local_338._M_dataplus._M_p,local_338._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," [options]\n\n",0xc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318.m_path._M_dataplus._M_p != &local_318.m_path.field_2) {
      operator_delete(local_318.m_path._M_dataplus._M_p,
                      local_318.m_path.field_2._M_allocated_capacity + 1);
    }
    de::cmdline::detail::Parser::help(&local_350,(ostream *)&local_2f8);
  }
  de::cmdline::detail::CommandLine::clear(this_00);
  this->m_logFlags = 0;
  bVar7 = false;
LAB_00307323:
  de::cmdline::detail::Parser::~Parser(&local_350);
  std::ios_base::~ios_base(local_2f0);
  DebugOutStreambuf::~DebugOutStreambuf(&local_1e8);
  return bVar7;
}

Assistant:

bool CommandLine::parse (int argc, const char* const* argv)
{
	DebugOutStreambuf	sbuf;
	std::ostream		debugOut	(&sbuf);
	de::cmdline::Parser	parser;

	opt::registerOptions(parser);
	opt::registerLegacyOptions(parser);
	registerExtendedOptions(parser);

	clear();

	if (!parser.parse(argc-1, argv+1, &m_cmdLine, std::cerr))
	{
		debugOut << "\n" << de::FilePath(argv[0]).getBaseName() << " [options]\n\n";
		parser.help(debugOut);

		clear();
		return false;
	}

	if (!m_cmdLine.getOption<opt::LogImages>())
		m_logFlags |= QP_TEST_LOG_EXCLUDE_IMAGES;

	if (!m_cmdLine.getOption<opt::LogShaderSources>())
		m_logFlags |= QP_TEST_LOG_EXCLUDE_SHADER_SOURCES;

	if (!m_cmdLine.getOption<opt::LogFlush>())
		m_logFlags |= QP_TEST_LOG_NO_FLUSH;

	if ((m_cmdLine.hasOption<opt::CasePath>()?1:0) +
		(m_cmdLine.hasOption<opt::CaseList>()?1:0) +
		(m_cmdLine.hasOption<opt::CaseListFile>()?1:0) +
		(m_cmdLine.hasOption<opt::CaseListResource>()?1:0) +
		(m_cmdLine.getOption<opt::StdinCaseList>()?1:0) > 1)
	{
		debugOut << "ERROR: multiple test case list options given!\n" << std::endl;
		clear();
		return false;
	}

	return true;
}